

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

AABox * __thiscall Triangle::boundingVolume(AABox *__return_storage_ptr__,Triangle *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar1 = (this->v1).x;
  uVar4 = (this->v1).y;
  uVar2 = (this->v2).x;
  uVar5 = (this->v2).y;
  uVar3 = (this->v3).x;
  uVar6 = (this->v3).y;
  fVar11 = (float)(~-(uint)((float)uVar3 < (float)uVar2) & uVar2 |
                  uVar3 & -(uint)((float)uVar3 < (float)uVar2));
  fVar12 = (float)(~-(uint)((float)uVar6 < (float)uVar5) & uVar5 |
                  uVar6 & -(uint)((float)uVar6 < (float)uVar5));
  fVar13 = (float)(~-(uint)((float)uVar2 < (float)uVar3) & uVar2 |
                  uVar3 & -(uint)((float)uVar2 < (float)uVar3));
  fVar14 = (float)(~-(uint)((float)uVar5 < (float)uVar6) & uVar5 |
                  uVar6 & -(uint)((float)uVar5 < (float)uVar6));
  uVar7 = -(uint)(fVar11 < (float)uVar1);
  uVar8 = -(uint)(fVar12 < (float)uVar4);
  uVar9 = -(uint)((float)uVar1 < fVar13);
  uVar10 = -(uint)((float)uVar4 < fVar14);
  __return_storage_ptr__->x1 = (float)(~uVar7 & uVar1 | (uint)fVar11 & uVar7);
  __return_storage_ptr__->x2 = (float)(~uVar9 & uVar1 | (uint)fVar13 & uVar9);
  __return_storage_ptr__->y1 = (float)(~uVar8 & uVar4 | (uint)fVar12 & uVar8);
  __return_storage_ptr__->y2 = (float)(~uVar10 & uVar4 | (uint)fVar14 & uVar10);
  fVar11 = (this->v3).z;
  fVar12 = (this->v1).z;
  fVar13 = (this->v2).z;
  fVar14 = fVar11;
  if (fVar13 <= fVar11) {
    fVar14 = fVar13;
  }
  if (fVar12 <= fVar14) {
    fVar14 = fVar12;
  }
  __return_storage_ptr__->z1 = fVar14;
  if (fVar11 <= fVar13) {
    fVar11 = fVar13;
  }
  if (fVar11 <= fVar12) {
    fVar11 = fVar12;
  }
  __return_storage_ptr__->z2 = fVar11;
  return __return_storage_ptr__;
}

Assistant:

AABox boundingVolume() const
	{
		AABox v;
		v.x1 = std::min(v1.x, std::min(v2.x, v3.x));
		v.x2 = std::max(v1.x, std::max(v2.x, v3.x));
		v.y1 = std::min(v1.y, std::min(v2.y, v3.y));
		v.y2 = std::max(v1.y, std::max(v2.y, v3.y));
		v.z1 = std::min(v1.z, std::min(v2.z, v3.z));
		v.z2 = std::max(v1.z, std::max(v2.z, v3.z));
		return v;
	}